

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall
ki::dml::Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
set_value(Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,FieldBase *other)

{
  _func_int **pp_Var1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  char *pcVar5;
  value_error *this_00;
  ostringstream oss;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  string local_1b8;
  ostringstream local_198 [376];
  
  sVar3 = std::type_info::hash_code((type_info *)&std::__cxx11::string::typeinfo);
  if (sVar3 == other->m_type_hash) {
    pp_Var1 = other[1].super_Serializable._vptr_Serializable;
    local_1d8[0] = local_1c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,pp_Var1,other[1].m_name._M_dataplus._M_p + (long)pp_Var1);
    std::__cxx11::string::_M_assign((string *)&this->m_value);
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0]);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Tried to copy value from ",0x19);
  iVar2 = (*(other->super_Serializable)._vptr_Serializable[5])(other);
  poVar4 = std::operator<<((ostream *)local_198,(char *)CONCAT44(extraout_var,iVar2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," field to ",10);
  pcVar5 = get_type_name(this);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," field.",7);
  this_00 = (value_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_00,&local_1b8);
  __cxa_throw(this_00,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_value(FieldBase *other) final
		{
			if (other->is_type<ValueT>())
			{
				auto *real_other = dynamic_cast<Field<ValueT> *>(other);
				set_value(real_other->get_value());
			}
			else
			{
				std::ostringstream oss;
				oss << "Tried to copy value from " <<
					other->get_type_name() << " field to " <<
					get_type_name() << " field.";
				throw value_error(oss.str());
			}
		}